

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<tinyusdz::value::half,_3UL>_> *value)

{
  bool bVar1;
  half3 v;
  half3 local_1e;
  
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,&local_1e);
    if (bVar1) {
      nonstd::optional_lite::optional<std::array<tinyusdz::value::half,3ul>>::operator=
                ((optional<std::array<tinyusdz::value::half,3ul>> *)value,&local_1e);
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::half3> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::half3 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}